

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
::TryGetReference<Js::JavascriptString*>
          (BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
           *this,JavascriptString **key,SimpleDictionaryPropertyDescriptor<unsigned_short> **value,
          int *index)

{
  long lVar1;
  bool bVar2;
  hash_t hashCode;
  uint uVar3;
  DictionaryStats *this_00;
  CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,JsUtil::(anonymous_namespace)::KeyValueEntry>
  *this_01;
  uint uVar4;
  
  lVar1 = *(long *)this;
  uVar3 = 0;
  if (lVar1 != 0) {
    hashCode = GetHashCodeWithKey<Js::JavascriptString*>(key);
    uVar3 = BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
            ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar4 = *(uint *)(lVar1 + (ulong)uVar3 * 4);
    uVar3 = 0;
    if (-1 < (int)uVar4) {
      lVar1 = *(long *)(this + 8);
      uVar3 = 0;
      do {
        this_01 = (CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,JsUtil::(anonymous_namespace)::KeyValueEntry>
                   *)((ulong)uVar4 * 0x18 + lVar1);
        bVar2 = CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,JsUtil::(anonymous_namespace)::KeyValueEntry>
                ::
                KeyEquals<Js::PropertyRecordStringHashComparer<Js::JavascriptString*>,Js::JavascriptString*>
                          (this_01,key,hashCode);
        if (bVar2) {
          this_00 = *(DictionaryStats **)(this + 0x30);
          goto LAB_00e422c0;
        }
        uVar3 = uVar3 + 1;
        uVar4 = *(uint *)(this_01 + 4);
      } while (-1 < (int)uVar4);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar4 = 0xffffffff;
LAB_00e422c0:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  if (-1 < (int)uVar4) {
    *value = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
             ((ulong)uVar4 * 0x18 + *(long *)(this + 8));
    *index = uVar4;
  }
  return -1 < (int)uVar4;
}

Assistant:

bool TryGetReference(const TLookup& key, TValue** value, int* index) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = &entries[i].Value();
                *index = i;
                return true;
            }
            return false;
        }